

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O2

bool __thiscall
Js::ByteCodeWriter::TryWriteCallIWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
          (ByteCodeWriter *this,OpCode op,RegSlot returnValueRegister,RegSlot functionRegister,
          ArgSlot givenArgCount,InlineCacheIndex inlineCacheIndex,bool isRootLoad)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  long lVar5;
  ArgSlot local_3e;
  RegSlot local_3c;
  undefined1 auStack_38 [2];
  OpLayoutT_CallIWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> layout;
  size_t inlineCacheOffset;
  
  local_3e = givenArgCount;
  local_3c = returnValueRegister;
  _auStack_38 = functionRegister;
  layout.super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>.Return = inlineCacheIndex;
  uVar3 = Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,op,&local_3e,0xe,this);
  if (isRootLoad) {
    lVar5 = 3 - (ulong)(op < InvalidOpCode);
    if (lVar5 + (ulong)uVar3 + 0xe != (ulong)(this->m_byteCodeData).currentOffset) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x490,
                                  "(m_byteCodeData.GetCurrentOffset() == offset + OpCodeUtil::EncodedSize(op, SizePolicy::LayoutEnum) + sizeof(OpLayoutT_CallIWithICIndex<SizePolicy>))"
                                  ,
                                  "m_byteCodeData.GetCurrentOffset() == offset + OpCodeUtil::EncodedSize(op, SizePolicy::LayoutEnum) + sizeof(OpLayoutT_CallIWithICIndex<SizePolicy>)"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    layout._6_8_ = lVar5 + (ulong)uVar3 + 10;
    SListBase<unsigned_long,_Memory::ArenaAllocator,_RealCount>::Prepend
              (&this->rootObjectLoadMethodInlineCacheOffsets,
               (this->m_labelOffsets->
               super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).alloc,
               (unsigned_long *)
               &layout.super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>.Function);
  }
  return true;
}

Assistant:

bool ByteCodeWriter::TryWriteCallIWithICIndex(OpCode op, RegSlot returnValueRegister, RegSlot functionRegister, ArgSlot givenArgCount, InlineCacheIndex inlineCacheIndex, bool isRootLoad)
    {
        OpLayoutT_CallIWithICIndex<SizePolicy> layout;
        if (SizePolicy::Assign(layout.Return, returnValueRegister) && SizePolicy::Assign(layout.Function, functionRegister)
            && SizePolicy::Assign(layout.ArgCount, givenArgCount) && SizePolicy::Assign(layout.inlineCacheIndex, inlineCacheIndex))
        {
            size_t offset = m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);

            if (isRootLoad)
            {
                Assert(m_byteCodeData.GetCurrentOffset() == offset + OpCodeUtil::EncodedSize(op, SizePolicy::LayoutEnum) + sizeof(OpLayoutT_CallIWithICIndex<SizePolicy>));
                size_t inlineCacheOffset = offset + OpCodeUtil::EncodedSize(op, SizePolicy::LayoutEnum)
                    + offsetof(OpLayoutT_CallIWithICIndex<SizePolicy>, inlineCacheIndex);

                rootObjectLoadMethodInlineCacheOffsets.Prepend(m_labelOffsets->GetAllocator(), inlineCacheOffset);
            }
            return true;
        }
        return false;
    }